

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_strategies.cpp
# Opt level: O1

void __thiscall Clasp::BasicSatConfig::prepare(BasicSatConfig *this,SharedContext *ctx)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  uint32 uVar4;
  ulong uVar5;
  long lVar6;
  pointer pSVar7;
  uint uVar8;
  uint uVar9;
  
  uVar5 = (ulong)(this->solver_).ebo_.size;
  if (uVar5 == 0) {
    uVar8 = 0;
  }
  else {
    uVar1 = (this->search_).ebo_.size;
    lVar6 = 0;
    uVar9 = 0;
    uVar8 = 0;
    do {
      uVar4 = SolverParams::prepare
                        ((SolverParams *)
                         (&(((this->solver_).ebo_.buf)->super_SolverStrategies).field_0x0 + lVar6));
      uVar3 = (ulong)uVar9 % (ulong)uVar1;
      pSVar7 = (this->search_).ebo_.buf + uVar3;
      uVar2 = *(ulong *)(&(((this->solver_).ebo_.buf)->super_SolverStrategies).field_0x0 + lVar6);
      if (((uVar2 >> 0x33 & 1) != 0) ||
         (((undefined1  [16])(pSVar7->restart).rsSched.super_ScheduleStrategy &
          (undefined1  [16])0x3fffffff) == (undefined1  [16])0x0)) {
        (pSVar7->restart).block = (Block)0x0;
        *(undefined8 *)&(pSVar7->restart).field_0x18 = 0;
        *(undefined8 *)&(pSVar7->restart).rsSched.super_ScheduleStrategy = 0;
        (pSVar7->restart).rsSched.super_ScheduleStrategy.len = 0;
        (pSVar7->restart).rsSched.super_ScheduleStrategy.grow = 0.0;
      }
      uVar8 = uVar4 | uVar8;
      ReduceParams::prepare(&pSVar7->reduce,(uVar2 >> 0x33 & 1) == 0);
      if (((*(ushort *)(&(((this->solver_).ebo_.buf)->super_SolverStrategies).field_0x4 + lVar6) &
           0x180) == 0) && (((uint)(this->search_).ebo_.buf[uVar3].reduce.strategy & 0x7f) != 0)) {
        uVar8 = uVar8 | 8;
      }
      uVar9 = uVar9 + 1;
      lVar6 = lVar6 + 0x1c;
    } while (uVar5 * 0x1c != lVar6);
  }
  if ((uVar8 & 1) != 0) {
    SharedContext::warn(ctx,"Selected heuristic requires lookback strategy!");
  }
  if ((uVar8 & 2) != 0) {
    SharedContext::warn(ctx,"Heuristic \'Unit\' implies lookahead. Using \'atom\'.");
  }
  if ((uVar8 & 4) != 0) {
    SharedContext::warn(ctx,"Domain options require heuristic \'Domain\'!");
  }
  if ((uVar8 & 8) != 0) {
    SharedContext::warn(ctx,"Deletion protection requires LBD updates, which are off!");
    return;
  }
  return;
}

Assistant:

void BasicSatConfig::prepare(SharedContext& ctx) {
	uint32 warn = 0;
	for (uint32 i = 0, end = solver_.size(), mod = search_.size(); i != end; ++i) {
		warn |= solver_[i].prepare();
		warn |= search_[i%mod].prepare(solver_[i].search != SolverStrategies::no_learning);
		if (solver_[i].updateLbd == SolverStrategies::lbd_fixed && search_[i%mod].reduce.strategy.protect) { warn |= 8; }
	}
	if ((warn & 1) != 0) { ctx.warn("Selected heuristic requires lookback strategy!"); }
	if ((warn & 2) != 0) { ctx.warn("Heuristic 'Unit' implies lookahead. Using 'atom'."); }
	if ((warn & 4) != 0) { ctx.warn("Domain options require heuristic 'Domain'!"); }
	if ((warn & 8) != 0) { ctx.warn("Deletion protection requires LBD updates, which are off!"); }
}